

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constexpr_parser.h
# Opt level: O3

char * absl::lts_20250127::str_format_internal::ConsumeConversion<true>
                 (char *pos,char *end,UnboundConversion *conv,int *next_arg)

{
  char cVar1;
  byte bVar2;
  Flags FVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  byte *pbVar8;
  char *pcVar9;
  byte *pbVar10;
  long lVar11;
  Flags FVar12;
  int iVar13;
  char *pcVar14;
  byte *pbVar15;
  byte *pbVar16;
  byte *pbVar17;
  char *pcVar18;
  char *pcVar19;
  ConvTag tag;
  ConvTag tag_1;
  FormatConversionChar local_42;
  ConvTag local_41;
  char *local_40;
  char *local_38;
  
  if (pos == end) {
    return (char *)0x0;
  }
  if ((byte)(*pos - 0x3aU) < 0xf7) {
    return (char *)0x0;
  }
  iVar5 = (byte)*pos - 0x30;
  if (pos + 1 == end) {
    conv->arg_position = iVar5;
    return (char *)0x0;
  }
  iVar13 = -8;
  pcVar19 = pos + 1;
  do {
    pcVar9 = pcVar19;
    cVar1 = *pcVar9;
    if ((byte)(cVar1 - 0x3aU) < 0xf6) {
      pcVar14 = pcVar9 + 1;
      pcVar18 = pcVar9;
      break;
    }
    pcVar14 = pos + 10;
    pcVar18 = pos + 9;
    if (iVar13 == 0) break;
    iVar5 = (int)cVar1 + iVar5 * 10 + -0x30;
    iVar13 = iVar13 + 1;
    pcVar14 = end;
    pcVar19 = pcVar9 + 1;
    pcVar18 = pcVar9;
  } while (pcVar9 + 1 != end);
  conv->arg_position = iVar5;
  if (iVar5 < 1) {
    __assert_fail("conv->arg_position > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                  ,0xe7,
                  "const char *absl::str_format_internal::ConsumeConversion(const char *, const char *const, UnboundConversion *, int *) [is_positional = true]"
                 );
  }
  if (cVar1 != '$') {
    return (char *)0x0;
  }
  if (pcVar14 == end) {
    return (char *)0x0;
  }
  if (conv->flags != kBasic) {
    __assert_fail("conv->flags == Flags::kBasic",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                  ,0xee,
                  "const char *absl::str_format_internal::ConsumeConversion(const char *, const char *const, UnboundConversion *, int *) [is_positional = true]"
                 );
  }
  uVar7 = (ulong)*pcVar14;
  pbVar16 = (byte *)(pcVar18 + 2);
  if (0x40 < (long)uVar7) {
    local_42 = ConvTagHolder::value[uVar7].tag_;
    goto LAB_002d066c;
  }
  if (*pcVar14 < '1') {
    local_40 = pcVar18 + 0xb;
    local_38 = pcVar18 + 0xc;
    lVar11 = 0;
    FVar12 = kBasic;
    do {
      local_41.tag_ = ConvTagHolder::value[uVar7 & 0xff].tag_;
      if ((local_41.tag_ & 0xe0) != 0xc0) {
        if ((char)uVar7 != '*') {
          if ((int)(uVar7 & 0xff) == 0x30) goto LAB_002d03dd;
          goto LAB_002d0441;
        }
        FVar12 = FVar12 | kNonBasic;
        conv->flags = FVar12;
        if (pbVar16 == (byte *)end) {
          return (char *)0x0;
        }
        bVar2 = *pbVar16;
        if ((byte)(bVar2 - 0x3a) < 0xf7) {
          return (char *)0x0;
        }
        if (pcVar18 + (3 - lVar11) == end) {
          (conv->width).value_ = 0x2f - (uint)bVar2;
          return (char *)0x0;
        }
        uVar6 = bVar2 - 0x30;
        iVar5 = -8;
        pcVar19 = pcVar18 + (3 - lVar11);
        goto LAB_002d05b3;
      }
      FVar3 = ConvTag::as_flags(&local_41);
      FVar12 = FVar12 | FVar3;
      conv->flags = FVar12;
      if (pbVar16 == (byte *)end) {
        return (char *)0x0;
      }
      bVar2 = *pbVar16;
      uVar7 = (ulong)bVar2;
      pbVar16 = pbVar16 + 1;
      lVar11 = lVar11 + -1;
    } while ((char)bVar2 < '1');
  }
  else {
    FVar12 = kBasic;
  }
  if ((byte)uVar7 < 0x3a) {
LAB_002d03dd:
    iVar5 = ((uint)uVar7 & 0xff) - 0x30;
    if (pbVar16 == (byte *)end) {
      conv->flags = FVar12 | kNonBasic;
    }
    else {
      pbVar17 = pbVar16 + 9;
      iVar13 = -8;
      do {
        bVar2 = *pbVar16;
        uVar7 = (ulong)bVar2;
        if ((byte)(bVar2 - 0x3a) < 0xf6) {
          pbVar8 = pbVar16 + 1;
          break;
        }
        pbVar8 = pbVar17;
        if (iVar13 == 0) break;
        pbVar16 = pbVar16 + 1;
        iVar5 = (int)(char)bVar2 + iVar5 * 10 + -0x30;
        iVar13 = iVar13 + 1;
        pbVar8 = (byte *)end;
      } while (pbVar16 != (byte *)end);
      conv->flags = FVar12 | kNonBasic;
      pbVar16 = pbVar8;
      if (iVar5 < 0) goto LAB_002d07fd;
    }
    FVar12 = FVar12 | kNonBasic;
    (conv->width).value_ = iVar5;
    goto LAB_002d0441;
  }
  goto LAB_002d0651;
  while( true ) {
    pcVar9 = local_40 + -lVar11;
    pbVar17 = (byte *)(local_38 + -lVar11);
    if (iVar5 == 0) break;
    pcVar14 = pcVar19 + 1;
    uVar6 = ((int)cVar1 + uVar6 * 10) - 0x30;
    iVar5 = iVar5 + 1;
    pcVar9 = pcVar19;
    pbVar17 = (byte *)end;
    pcVar19 = pcVar14;
    if (pcVar14 == end) break;
LAB_002d05b3:
    cVar1 = *pcVar19;
    if ((byte)(cVar1 - 0x3aU) < 0xf6) {
      pcVar9 = pcVar19;
      pbVar17 = (byte *)(pcVar19 + 1);
      break;
    }
  }
  if ((int)uVar6 < 1) goto LAB_002d081c;
  (conv->width).value_ = ~uVar6;
  if (cVar1 != '$') {
    return (char *)0x0;
  }
  if (pbVar17 == (byte *)end) {
    return (char *)0x0;
  }
  pbVar16 = (byte *)(pcVar9 + 2);
  uVar7 = (ulong)*pbVar17;
LAB_002d0441:
  if ((char)uVar7 == '.') {
    conv->flags = FVar12 | kNonBasic;
    if (pbVar16 == (byte *)end) {
      return (char *)0x0;
    }
    pbVar17 = pbVar16 + 1;
    bVar2 = *pbVar16;
    uVar7 = (ulong)bVar2;
    if ((byte)(bVar2 - 0x30) < 10) {
      iVar5 = bVar2 - 0x30;
      if (pbVar17 != (byte *)end) {
        iVar13 = -8;
        do {
          bVar2 = *pbVar17;
          uVar7 = (ulong)bVar2;
          if ((byte)(bVar2 - 0x3a) < 0xf6) {
            pbVar8 = pbVar17 + 1;
            break;
          }
          pbVar8 = pbVar16 + 10;
          if (iVar13 == 0) break;
          pbVar17 = pbVar17 + 1;
          iVar5 = (int)(char)bVar2 + iVar5 * 10 + -0x30;
          iVar13 = iVar13 + 1;
          pbVar8 = (byte *)end;
        } while (pbVar17 != (byte *)end);
        pbVar17 = pbVar8;
        if (iVar5 < 0) {
LAB_002d07fd:
          __assert_fail("value >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                        ,0x2e,
                        "void absl::str_format_internal::UnboundConversion::InputValue::set_value(int)"
                       );
        }
      }
      (conv->precision).value_ = iVar5;
    }
    else if (bVar2 == 0x2a) {
      if (pbVar17 == (byte *)end) {
        return (char *)0x0;
      }
      bVar2 = *pbVar17;
      if ((byte)(bVar2 - 0x3a) < 0xf7) {
        return (char *)0x0;
      }
      if (pbVar16 + 2 == (byte *)end) {
        (conv->precision).value_ = 0x2f - (uint)bVar2;
        return (char *)0x0;
      }
      uVar6 = bVar2 - 0x30;
      iVar5 = -8;
      pbVar8 = pbVar16 + 2;
      do {
        pbVar15 = pbVar8;
        bVar2 = *pbVar15;
        if ((byte)(bVar2 - 0x3a) < 0xf6) {
          pbVar10 = pbVar15 + 1;
          pbVar17 = pbVar15;
          break;
        }
        pbVar10 = pbVar16 + 0xb;
        pbVar17 = pbVar16 + 10;
        if (iVar5 == 0) break;
        uVar6 = ((int)(char)bVar2 + uVar6 * 10) - 0x30;
        iVar5 = iVar5 + 1;
        pbVar10 = (byte *)end;
        pbVar8 = pbVar15 + 1;
        pbVar17 = pbVar15;
      } while (pbVar15 + 1 != (byte *)end);
      if ((int)uVar6 < 1) {
LAB_002d081c:
        __assert_fail("value > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                      ,0x39,
                      "void absl::str_format_internal::UnboundConversion::InputValue::set_from_arg(int)"
                     );
      }
      (conv->precision).value_ = ~uVar6;
      if (bVar2 != 0x24) {
        return (char *)0x0;
      }
      if (pbVar10 == (byte *)end) {
        return (char *)0x0;
      }
      pbVar17 = pbVar17 + 2;
      uVar7 = (ulong)*pbVar10;
    }
    else {
      (conv->precision).value_ = 0;
    }
    FVar12 = kLeft;
    pbVar16 = pbVar17;
  }
LAB_002d0651:
  local_42 = ConvTagHolder::value[uVar7 & 0xff].tag_;
  if (((char)uVar7 == 'v') && (FVar12 != kBasic)) {
    return (char *)0x0;
  }
LAB_002d066c:
  if ((char)local_42 < '\0') {
    return (char *)0x0;
  }
  bVar4 = CheckFastPathSetting(conv);
  if (bVar4) {
    if ((char)local_42 < '\0') {
      __assert_fail("is_conv()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                    ,99,"FormatConversionChar absl::str_format_internal::ConvTag::as_conv() const");
    }
    conv->conv = local_42;
    return (char *)pbVar16;
  }
  __assert_fail("CheckFastPathSetting(*conv)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                ,0x14d,
                "const char *absl::str_format_internal::ConsumeConversion(const char *, const char *const, UnboundConversion *, int *) [is_positional = true]"
               );
}

Assistant:

constexpr const char* ConsumeConversion(const char* pos, const char* const end,
                                        UnboundConversion* conv,
                                        int* next_arg) {
  const char* const original_pos = pos;
  char c = 0;
  // Read the next char into `c` and update `pos`. Returns false if there are
  // no more chars to read.
#define ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR()          \
  do {                                                  \
    if (ABSL_PREDICT_FALSE(pos == end)) return nullptr; \
    c = *pos++;                                         \
  } while (0)

  if (is_positional) {
    ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    if (ABSL_PREDICT_FALSE(c < '1' || c > '9')) return nullptr;
    conv->arg_position = ParseDigits(c, pos, end);
    assert(conv->arg_position > 0);
    if (ABSL_PREDICT_FALSE(c != '$')) return nullptr;
  }

  ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();

  // We should start with the basic flag on.
  assert(conv->flags == Flags::kBasic);

  // Any non alpha character makes this conversion not basic.
  // This includes flags (-+ #0), width (1-9, *) or precision (.).
  // All conversion characters and length modifiers are alpha characters.
  if (c < 'A') {
    while (c <= '0') {
      auto tag = GetTagForChar(c);
      if (tag.is_flags()) {
        conv->flags = conv->flags | tag.as_flags();
        ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
      } else {
        break;
      }
    }

    if (c <= '9') {
      if (c >= '0') {
        int maybe_width = ParseDigits(c, pos, end);
        if (!is_positional && c == '$') {
          if (ABSL_PREDICT_FALSE(*next_arg != 0)) return nullptr;
          // Positional conversion.
          *next_arg = -1;
          return ConsumeConversion<true>(original_pos, end, conv, next_arg);
        }
        conv->flags = conv->flags | Flags::kNonBasic;
        conv->width.set_value(maybe_width);
      } else if (c == '*') {
        conv->flags = conv->flags | Flags::kNonBasic;
        ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        if (is_positional) {
          if (ABSL_PREDICT_FALSE(c < '1' || c > '9')) return nullptr;
          conv->width.set_from_arg(ParseDigits(c, pos, end));
          if (ABSL_PREDICT_FALSE(c != '$')) return nullptr;
          ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        } else {
          conv->width.set_from_arg(++*next_arg);
        }
      }
    }

    if (c == '.') {
      conv->flags = conv->flags | Flags::kNonBasic;
      ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
      if ('0' <= c && c <= '9') {
        conv->precision.set_value(ParseDigits(c, pos, end));
      } else if (c == '*') {
        ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        if (is_positional) {
          if (ABSL_PREDICT_FALSE(c < '1' || c > '9')) return nullptr;
          conv->precision.set_from_arg(ParseDigits(c, pos, end));
          if (c != '$') return nullptr;
          ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        } else {
          conv->precision.set_from_arg(++*next_arg);
        }
      } else {
        conv->precision.set_value(0);
      }
    }
  }

  auto tag = GetTagForChar(c);

  if (ABSL_PREDICT_FALSE(c == 'v' && conv->flags != Flags::kBasic)) {
    return nullptr;
  }

  if (ABSL_PREDICT_FALSE(!tag.is_conv())) {
    if (ABSL_PREDICT_FALSE(!tag.is_length())) return nullptr;

    // It is a length modifier.
    LengthMod length_mod = tag.as_length();
    ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    if (c == 'h' && length_mod == LengthMod::h) {
      conv->length_mod = LengthMod::hh;
      ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    } else if (c == 'l' && length_mod == LengthMod::l) {
      conv->length_mod = LengthMod::ll;
      ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    } else {
      conv->length_mod = length_mod;
    }
    tag = GetTagForChar(c);

    if (ABSL_PREDICT_FALSE(c == 'v')) return nullptr;
    if (ABSL_PREDICT_FALSE(!tag.is_conv())) return nullptr;

    // `wchar_t` args are marked non-basic so `Bind()` will copy the length mod.
    if (conv->length_mod == LengthMod::l && c == 'c') {
      conv->flags = conv->flags | Flags::kNonBasic;
    }
  }
#undef ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR

  assert(CheckFastPathSetting(*conv));
  (void)(&CheckFastPathSetting);

  conv->conv = tag.as_conv();
  if (!is_positional) conv->arg_position = ++*next_arg;
  return pos;
}